

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::Matcher::Matcher(Matcher *this,Matcher *other)

{
  size_t sVar1;
  undefined4 uVar2;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<char,_false>_>_> local_28;
  
  (this->shortFlags)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->shortFlags)._M_h._M_bucket_count = (other->shortFlags)._M_h._M_bucket_count;
  (this->shortFlags)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->shortFlags)._M_h._M_element_count = (other->shortFlags)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(other->shortFlags)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (other->shortFlags)._M_h._M_rehash_policy._M_next_resize;
  (this->shortFlags)._M_h._M_rehash_policy._M_max_load_factor =
       (other->shortFlags)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->shortFlags)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->shortFlags)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->shortFlags)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_28._M_h = (__hashtable_alloc *)this;
  std::
  _Hashtable<char,char,std::allocator<char>,std::__detail::_Identity,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<char,char,std::allocator<char>,std::__detail::_Identity,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<char,false>>>>
            ((_Hashtable<char,char,std::allocator<char>,std::__detail::_Identity,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)this,(_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)other,&local_28);
  local_28._M_h = (__hashtable_alloc *)&this->longFlags;
  (this->longFlags)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->longFlags)._M_h._M_bucket_count = (other->longFlags)._M_h._M_bucket_count;
  (this->longFlags)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->longFlags)._M_h._M_element_count = (other->longFlags)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(other->longFlags)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (other->longFlags)._M_h._M_rehash_policy._M_next_resize;
  (this->longFlags)._M_h._M_rehash_policy._M_max_load_factor =
       (other->longFlags)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->longFlags)._M_h._M_rehash_policy.field_0x4 = uVar2;
  (this->longFlags)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (this->longFlags)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_28._M_h,&(other->longFlags)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_28);
  return;
}

Assistant:

Matcher(Matcher &&other) : shortFlags(std::move(other.shortFlags)), longFlags(std::move(other.longFlags))
            {}